

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraDataflow_cpp.h
# Opt level: O1

u32 __thiscall moira::Moira::readM<(moira::MemSpace)2,(moira::Size)2,4ul>(Moira *this,u32 addr)

{
  bool bVar1;
  uint uVar2;
  
  this->fcl = '\x02';
  if ((this->flags & 0x8000) != 0) {
    bVar1 = Debugger::watchpointMatches(&this->debugger,addr,Word);
    if (bVar1) {
      (*this->_vptr_Moira[0x18])(this,addr);
    }
  }
  (*this->_vptr_Moira[0x19])(this,2);
  (this->reg).ipl = this->ipl;
  uVar2 = (*this->_vptr_Moira[3])(this,(ulong)(addr & 0xffffff));
  (*this->_vptr_Moira[0x19])(this,2);
  return uVar2 & 0xffff;
}

Assistant:

u32
Moira::readM(u32 addr)
{
    u32 result;
        
    // Break down long word accesses into two word accesses
    if (S == Long) {
        result = readM<M, Word>(addr) << 16;
        result |= readM<M, Word, F>(addr + 2);
        return result;
    }
    
    // Update function code pins
    setFC(M == MEM_DATA ? FC_USER_DATA : FC_USER_PROG);

    // Check if a watchpoint is being accessed
    if ((flags & CPU_CHECK_WP) && debugger.watchpointMatches(addr, S)) {
        watchpointReached(addr);
    }
    
    // Perform the read operation
    sync(2);
    if (F & POLLIPL) pollIrq();
    result = (S == Byte) ? read8(addr & 0xFFFFFF) : read16(addr & 0xFFFFFF);
    sync(2);
    
    return result;
}